

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_sync(void)

{
  bool bVar1;
  int iVar2;
  MPI_Comm poVar3;
  exception *e_1;
  exception *e;
  undefined1 local_58 [7];
  bool dummy_bsmp;
  TicToc t;
  undefined1 local_28 [8];
  TicToc imb;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_sync: can only be called within SPMD section\n");
  }
  iVar2 = bsplib::Spmd::normal_sync(s_spmd);
  if (iVar2 != 0) {
    bsp_abort(
             "bsp_sync/bsp_end: Some processes have called bsp_sync, while others have called bsp_end instead\n"
             );
  }
  bsplib::TicToc::TicToc((TicToc *)local_28,IMBALANCE,0);
  poVar3 = bsplib::Spmd::comm(s_spmd);
  MPI_Barrier(poVar3);
  bsplib::TicToc::~TicToc((TicToc *)local_28);
  bsplib::TicToc::TicToc((TicToc *)local_58,SYNC,0);
  bsplib::Bsmp::is_dummy(s_bsmp);
  bsplib::Rdma::sync(s_rdma);
  bsplib::Bsmp::sync(s_bsmp);
  bsplib::TicToc::~TicToc((TicToc *)local_58);
  return;
}

Assistant:

void bsp_sync()
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_sync: can only be called within SPMD section\n");

    if (s_spmd->normal_sync())
        bsp_abort("bsp_sync/bsp_end: Some processes have called bsp_sync, "
               "while others have called bsp_end instead\n");

#ifdef PROFILE
    { TicToc imb( TicToc::IMBALANCE );
      MPI_Barrier( s_spmd->comm() );
    }
#endif

#ifdef PROFILE
    TicToc t( TicToc::SYNC );
#endif
    bool dummy_bsmp = s_bsmp->is_dummy();

    try {
        dummy_bsmp = s_rdma->sync( dummy_bsmp );
    }
    catch( bsplib :: exception & e ) {
        bsp_abort("bsp_sync/%s\n", e.str().c_str() );
    }

    try {
        s_bsmp->sync( dummy_bsmp );
    }
    catch( bsplib  :: exception & e ) {
        bsp_abort("bsp_sync/%s\n", e.str().c_str() );
    }
}